

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_strfmt.c
# Opt level: O1

char * lj_strfmt_wstrnum(lua_State *L,cTValue *o,MSize *lenp)

{
  ulong uVar1;
  uint64_t uVar2;
  ulong uVar3;
  SBuf *pSVar4;
  char *pcVar5;
  int iVar6;
  
  uVar1 = o->u64;
  if ((long)uVar1 >> 0x2f == -0xd) {
    uVar3 = uVar1 & 0x7fffffffffff;
    if (*(char *)(uVar3 + 10) == '\x03') {
      iVar6 = *(int *)(uVar3 + 0x30);
      pcVar5 = *(char **)(uVar3 + 0x58);
      goto LAB_001180f5;
    }
  }
  else if ((long)uVar1 >> 0x2f == -5) {
    *lenp = *(MSize *)((uVar1 & 0x7fffffffffff) + 0x14);
    return (char *)((o->u64 & 0x7fffffffffff) + 0x18);
  }
  if (0xfff8 < (ushort)(uVar1 >> 0x30)) {
    return (char *)0x0;
  }
  uVar2 = (L->glref).ptr64;
  *(lua_State **)(uVar2 + 0xe0) = L;
  *(undefined8 *)(uVar2 + 200) = *(undefined8 *)(uVar2 + 0xd8);
  pSVar4 = lj_strfmt_putfnum((SBuf *)(uVar2 + 200),0xf000035,o->n);
  iVar6 = *(int *)&pSVar4->w;
  pcVar5 = pSVar4->b;
LAB_001180f5:
  *lenp = iVar6 - (int)pcVar5;
  return pcVar5;
}

Assistant:

const char *lj_strfmt_wstrnum(lua_State *L, cTValue *o, MSize *lenp)
{
  SBuf *sb;
  if (tvisstr(o)) {
    *lenp = strV(o)->len;
    return strVdata(o);
  } else if (tvisbuf(o)) {
    SBufExt *sbx = bufV(o);
    *lenp = sbufxlen(sbx);
    return sbx->r;
  } else if (tvisint(o)) {
    sb = lj_strfmt_putint(lj_buf_tmp_(L), intV(o));
  } else if (tvisnum(o)) {
    sb = lj_strfmt_putfnum(lj_buf_tmp_(L), STRFMT_G14, o->n);
  } else {
    return NULL;
  }
  *lenp = sbuflen(sb);
  return sb->b;
}